

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  vector<char,_std::allocator<char>_> *this;
  byte *pbVar1;
  pointer ppcVar2;
  pointer puVar3;
  pointer pAVar4;
  pointer pAVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  bool bVar8;
  uint16_t uVar9;
  int iVar10;
  uint uVar11;
  size_t sVar12;
  ulong uVar13;
  pointer pAVar14;
  undefined4 extraout_var;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>,_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  pbVar15;
  int *piVar16;
  char *pcVar17;
  undefined8 extraout_RAX;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  *__args_1;
  vector<char_*,_std::allocator<char_*>_> *pvVar18;
  uint uVar19;
  int *__args;
  int *extraout_RDX;
  char **ppcVar20;
  char *pcVar21;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  *__p;
  pointer puVar22;
  long lVar23;
  ulong uVar24;
  pointer __a;
  int argc_00;
  _Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true> _Var25;
  optional<std::filesystem::__cxx11::path> *this_00;
  pointer pAVar26;
  initializer_list<char_*> __l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> offsets;
  vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> atFileStack;
  File file;
  AtFileStackEntry *local_1d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  char *in_stack_fffffffffffffe50;
  vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_> local_1a8;
  AtFileStackEntry *local_190;
  uint local_184;
  char *local_180;
  __visit_result_t<Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>,_const_std::variant<std::basic_streambuf<char>_*,_std::basic_filebuf<char>_>_&>
  local_178;
  path local_158;
  _Variadic_union<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
  local_130;
  undefined1 local_40;
  Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:90:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:91:29)>
  local_38;
  
  local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar13 = (ulong)(uint)argc;
  local_190 = (AtFileStackEntry *)argv;
  local_184 = argc;
  local_1d0 = (AtFileStackEntry *)argv;
  do {
    argc_00 = (int)uVar13;
    ppcVar20 = (char **)local_1d0;
    iVar10 = musl_getopt_long_only
                       (argc_00,(char **)local_1d0,"-Aa:b:Cc:Dd:FfhL:mN:n:Oo:Pp:Qq:r:s:Tt:U:uVvx:Z",
                        longopts,(int *)0x0);
    pcVar17 = musl_optarg;
    if (iVar10 == -1) {
      in_stack_fffffffffffffe50 = (char *)0x0;
      goto LAB_0010520c;
    }
    local_130._M_first._M_storage =
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
         (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)musl_optarg;
    if (iVar10 < 0x41) {
      if (iVar10 < -0x41) {
        if (iVar10 == -0x54) {
          warning("`--output-tilemap` is deprecated, use `--auto-tilemap` instead");
          goto switchD_00104a27_caseD_54;
        }
        if (iVar10 == -0x51) {
          warning("`--output-palette-map` is deprecated, use `--auto-palette-map` instead");
          goto switchD_00104a27_caseD_51;
        }
        if (iVar10 == -0x50) {
          warning("`--output-palette` is deprecated, use `--auto-palette` instead");
          goto switchD_00104a27_caseD_50;
        }
      }
      else {
        if (iVar10 == 1) {
          if (*musl_optarg == '@') {
            in_stack_fffffffffffffe50 = musl_optarg + 1;
            bVar8 = false;
          }
          else {
            bVar8 = true;
            registerInput((char *)0x10507d);
          }
          goto LAB_0010510b;
        }
        if (iVar10 == -0x41) {
          warning("`--output-attr-map` is deprecated, use `--auto-attr-map` instead");
          goto switchD_00104a27_caseD_41;
        }
      }
switchD_00104a27_caseD_42:
      main_cold_15();
      goto LAB_001059a6;
    }
    switch(iVar10) {
    case 0x41:
switchD_00104a27_caseD_41:
      _ZL12localOptions_1 = 1;
      break;
    default:
      goto switchD_00104a27_caseD_42;
    case 0x43:
      options.useColorCurve = true;
      break;
    case 0x4c:
      pcVar17 = "Input slice left coordinate";
      options.inputSlice.left =
           parseNumber((char **)&local_130._M_first,"Input slice left coordinate",0xffff);
      uVar7 = local_130._M_first._M_storage;
      if ((short)options.inputSlice.left < 0) {
        error("Input slice left coordinate is out of range!");
        ppcVar20 = (char **)pcVar17;
      }
      else {
        pcVar17 = " \t";
        sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
        _Var25._M_storage = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12);
        if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12) ==
            (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + 1);
          sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + sVar12 + 1);
          options.inputSlice.top =
               parseNumber((char **)&local_130._M_first,"Input slice upper coordinate",0xffff);
          uVar7 = local_130._M_first._M_storage;
          pcVar17 = " \t";
          sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
          _Var25._M_storage = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12);
          if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12) !=
              (basic_streambuf<char,_std::char_traits<char>_>)0x3a) {
            local_130._M_first._M_storage =
                 (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
                 _Var25._M_storage;
            main_cold_8();
            ppcVar20 = (char **)pcVar17;
            argv = (char **)local_190;
            goto LAB_00105091;
          }
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + 1);
          sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + sVar12 + 1);
          uVar9 = parseNumber((char **)&local_130._M_first,"Input slice width",0xffff);
          uVar7 = local_130._M_first._M_storage;
          pcVar17 = " \t";
          options.inputSlice.width = uVar9;
          sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
          _Var25._M_storage = (basic_streambuf<char,_std::char_traits<char>_> *)(sVar12 + uVar7);
          ppcVar20 = (char **)pcVar17;
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               _Var25._M_storage;
          if (uVar9 == 0) {
            error("Input slice width may not be 0!");
            ppcVar20 = (char **)pcVar17;
          }
          argv = (char **)local_190;
          if (*_Var25._M_storage == (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
            local_130._M_first._M_storage =
                 (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
                 (_Var25._M_storage + 1);
            sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
            local_130._M_first._M_storage =
                 (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
                 (_Var25._M_storage + sVar12 + 1);
            pcVar17 = "Input slice height";
            options.inputSlice.height =
                 parseNumber((char **)&local_130._M_first,"Input slice height",0xffff);
            ppcVar20 = (char **)pcVar17;
            if (options.inputSlice.height == 0) {
              error("Input slice height may not be 0!");
              ppcVar20 = (char **)pcVar17;
            }
            bVar8 = true;
            if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
                (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
              main_cold_10();
            }
            goto LAB_0010510b;
          }
          main_cold_9();
        }
        else {
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               _Var25._M_storage;
          main_cold_7();
          ppcVar20 = (char **)pcVar17;
        }
      }
      break;
    case 0x4e:
      pcVar17 = "Number of tiles in bank 0";
      options.maxNbTiles._M_elems[0] =
           parseNumber((char **)&local_130._M_first,"Number of tiles in bank 0",0x100);
      ppcVar20 = (char **)pcVar17;
      if (0x100 < options.maxNbTiles._M_elems[0]) {
        error("Bank 0 cannot contain more than 256 tiles");
        ppcVar20 = (char **)pcVar17;
      }
      uVar7 = local_130._M_first._M_storage;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage ==
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        options.maxNbTiles._M_elems[1] = 0;
      }
      else {
        pcVar17 = " \t";
        sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
        _Var25._M_storage = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12);
        if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12) ==
            (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + 1);
          sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + sVar12 + 1);
          pcVar17 = "Number of tiles in bank 1";
          options.maxNbTiles._M_elems[1] =
               parseNumber((char **)&local_130._M_first,"Number of tiles in bank 1",0x100);
          ppcVar20 = (char **)pcVar17;
          if (0x100 < options.maxNbTiles._M_elems[1]) {
            error("Bank 1 cannot contain more than 256 tiles");
            ppcVar20 = (char **)pcVar17;
          }
          bVar8 = true;
          if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
              (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
            main_cold_6();
          }
          goto LAB_0010510b;
        }
        local_130._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             _Var25._M_storage;
        main_cold_5();
        ppcVar20 = (char **)pcVar17;
      }
LAB_00105091:
      bVar8 = true;
      goto LAB_0010510b;
    case 0x4f:
      _ZL12localOptions_5 = 1;
      break;
    case 0x50:
switchD_00104a27_caseD_50:
      _ZL12localOptions_3 = 1;
      break;
    case 0x51:
switchD_00104a27_caseD_51:
      _ZL12localOptions_4 = 1;
      break;
    case 0x54:
switchD_00104a27_caseD_54:
      _ZL12localOptions_2 = 1;
      break;
    case 0x56:
      pcVar17 = get_package_version_string();
      printf("rgbgfx %s\n",pcVar17);
      exit(0);
    case 0x5a:
      options.columnMajor = true;
      break;
    case 0x61:
      _ZL12localOptions_1 = 0;
      this_00 = &options.attrmap;
      if (options.attrmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
        pcVar17 = "Overriding attrmap file %s";
LAB_00104fac:
        warning(pcVar17,(pointer)(this_00->
                                 super__Optional_base<std::filesystem::__cxx11::path,_false,_false>)
                                 ._M_payload.
                                 super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>
                                 .super__Optional_payload_base<std::filesystem::__cxx11::path>.
                                 _M_payload._M_value._M_pathname._M_dataplus);
      }
      goto LAB_00104fb6;
    case 0x62:
      pcVar17 = "Bank 0 base tile ID";
      uVar9 = parseNumber((char **)&local_130._M_first,"Bank 0 base tile ID",0);
      uVar7 = local_130._M_first._M_storage;
      options.baseTileIDs._M_elems[0] = (uchar)uVar9;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage ==
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        options.baseTileIDs._M_elems[1] = '\0';
        ppcVar20 = (char **)pcVar17;
      }
      else {
        pcVar17 = " \t";
        sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
        _Var25._M_storage = (basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12);
        if (*(basic_streambuf<char,_std::char_traits<char>_> *)(uVar7 + sVar12) ==
            (basic_streambuf<char,_std::char_traits<char>_>)0x2c) {
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + 1);
          sVar12 = strspn((char *)local_130._M_first._M_storage," \t");
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               (_Var25._M_storage + sVar12 + 1);
          pcVar17 = "Bank 1 base tile ID";
          uVar9 = parseNumber((char **)&local_130._M_first,"Bank 1 base tile ID",0);
          options.baseTileIDs._M_elems[1] = (uchar)uVar9;
          bVar8 = true;
          ppcVar20 = (char **)pcVar17;
          if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
              (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
            main_cold_14();
            ppcVar20 = (char **)pcVar17;
          }
          goto LAB_0010510b;
        }
        local_130._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             _Var25._M_storage;
        main_cold_13();
        ppcVar20 = (char **)pcVar17;
      }
      break;
    case 99:
      if (*musl_optarg != '#') {
        pcVar21 = "embedded";
        iVar10 = strcasecmp(musl_optarg,"embedded");
        ppcVar20 = (char **)pcVar21;
        if (iVar10 == 0) {
          options.palSpecType = EMBEDDED;
        }
        else {
          options.palSpecType = EXPLICIT;
          _ZL12localOptions_0 = pcVar17;
        }
        break;
      }
      options.palSpecType = EXPLICIT;
      bVar8 = true;
      parseInlinePalSpec(in_stack_fffffffffffffe50);
      goto LAB_0010510b;
    case 100:
      pcVar17 = "Bit depth";
      uVar9 = parseNumber((char **)&local_130._M_first,"Bit depth",2);
      options.bitDepth = (uint8_t)uVar9;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        main_cold_11();
        ppcVar20 = (char **)pcVar17;
        break;
      }
      bVar8 = true;
      ppcVar20 = (char **)pcVar17;
      if ((ushort)((uVar9 & 0xff) - 3) < 0xfffe) {
        main_cold_12();
        ppcVar20 = (char **)pcVar17;
      }
      goto LAB_0010510b;
    case 0x6d:
      options.allowMirroring = true;
    case 0x75:
      options.allowDedup = true;
      break;
    case 0x6e:
      pcVar17 = "Number of palettes";
      uVar9 = parseNumber((char **)&local_130._M_first,"Number of palettes",0x100);
      options.nbPalettes = (uint8_t)uVar9;
      ppcVar20 = (char **)pcVar17;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        main_cold_4();
        ppcVar20 = (char **)pcVar17;
      }
      bVar8 = true;
      if (options.nbPalettes == '\0') {
        pcVar17 = "Number of palettes (-n) may not be 0!";
LAB_00105021:
        bVar8 = true;
        error(pcVar17);
      }
      goto LAB_0010510b;
    case 0x6f:
      this_00 = &options.output;
      if (options.output.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar17 = "Overriding tile data file %s";
        goto LAB_00104fac;
      }
      goto LAB_00104fb6;
    case 0x70:
      _ZL12localOptions_3 = 0;
      this_00 = &options.palettes;
      if (options.palettes.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar17 = "Overriding palettes file %s";
        goto LAB_00104fac;
      }
      goto LAB_00104fb6;
    case 0x71:
      _ZL12localOptions_4 = 0;
      this_00 = &options.palmap;
      if (options.palmap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar17 = "Overriding palette map file %s";
        goto LAB_00104fac;
      }
      goto LAB_00104fb6;
    case 0x72:
      pcVar17 = "Reversed image stride";
      options.reversedWidth =
           parseNumber((char **)&local_130._M_first,"Reversed image stride",0xffff);
      ppcVar20 = (char **)pcVar17;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        main_cold_3();
        ppcVar20 = (char **)pcVar17;
      }
      bVar8 = true;
      if (options.reversedWidth == 0) {
        pcVar17 = "Reversed image stride (-r) may not be 0!";
        goto LAB_00105021;
      }
      goto LAB_0010510b;
    case 0x73:
      pcVar17 = "Number of colors per palette";
      uVar9 = parseNumber((char **)&local_130._M_first,"Number of colors per palette",4);
      options.nbColorsPerPal = (uint8_t)uVar9;
      ppcVar20 = (char **)pcVar17;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        main_cold_2();
        ppcVar20 = (char **)pcVar17;
      }
      if (options.nbColorsPerPal < 5) {
        bVar8 = true;
        if (options.nbColorsPerPal == '\0') {
          pcVar17 = "Palette size (-s) may not be 0!";
          goto LAB_00105021;
        }
      }
      else {
        error("Palette size (-s) must not exceed 4!");
        bVar8 = true;
      }
      goto LAB_0010510b;
    case 0x74:
      _ZL12localOptions_2 = 0;
      this_00 = &options.tilemap;
      if (options.tilemap.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
          _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
          super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != false) {
        pcVar17 = "Overriding tilemap file %s";
        goto LAB_00104fac;
      }
LAB_00104fb6:
      bVar8 = true;
      ppcVar20 = &musl_optarg;
      std::optional<std::filesystem::__cxx11::path>::operator=(this_00,&musl_optarg);
      goto LAB_0010510b;
    case 0x76:
      bVar8 = true;
      if (options.verbosity < 6) {
        options.verbosity = options.verbosity + '\x01';
      }
      goto LAB_0010510b;
    case 0x78:
      pcVar17 = "Number of tiles to trim";
      uVar9 = parseNumber((char **)&local_130._M_first,"Number of tiles to trim",0);
      options.trim = (uint64_t)uVar9;
      bVar8 = true;
      ppcVar20 = (char **)pcVar17;
      if (*(basic_streambuf<char,_std::char_traits<char>_> *)local_130._M_first._M_storage !=
          (basic_streambuf<char,_std::char_traits<char>_>)0x0) {
        main_cold_1();
        ppcVar20 = (char **)pcVar17;
      }
      goto LAB_0010510b;
    }
    bVar8 = true;
LAB_0010510b:
    if (!bVar8) {
LAB_0010520c:
      if (in_stack_fffffffffffffe50 == (char *)0x0) {
        lVar23 = (long)musl_optind;
        if (musl_optind != argc_00) {
          if (argc_00 <= musl_optind) {
            __assert_fail("musl_optind < curArgc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/main.cpp"
                          ,0x276,"main");
          }
          do {
            registerInput((char *)0x105286);
            lVar23 = lVar23 + 1;
          } while (argc_00 != lVar23);
        }
        pAVar5 = local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pAVar4 = local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          bVar8 = true;
        }
        else {
          pAVar14 = local_1a8.
                    super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
          musl_optind = local_1a8.
                        super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].parentInd;
          local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
          super__Vector_impl_data._M_finish = pAVar14;
          std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
          destroy<main::AtFileStackEntry>((allocator_type *)pAVar14,(AtFileStackEntry *)ppcVar20);
          if (pAVar4 == pAVar14) {
            uVar13 = (ulong)local_184;
            local_1d0 = (AtFileStackEntry *)argv;
          }
          else {
            local_1d0 = (AtFileStackEntry *)
                        pAVar5[-2].argv.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
            uVar13 = (ulong)((long)pAVar5[-2].argv.
                                   super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)local_1d0) >> 3;
          }
          bVar8 = false;
        }
      }
      else {
        __l._M_len = 1;
        __l._M_array = (iterator)&local_158;
        __args_1 = &local_178;
        local_158._M_pathname._M_dataplus._M_p = in_stack_fffffffffffffe50;
        std::vector<char_*,_std::allocator<char_*>_>::vector
                  ((vector<char_*,_std::allocator<char_*>_> *)&local_130._M_first,__l,
                   (allocator_type *)&local_178);
        pAVar5 = local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pAVar4 = local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)local_1a8.
                    super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_1a8.
                    super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
                    super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar23 = (long)local_1a8.
                         super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1a8.
                         super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3;
          uVar24 = lVar23 * 0x6db6db6db6db6db7;
          uVar13 = uVar24;
          if (local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar13 = 1;
          }
          in_stack_fffffffffffffe50 = (char *)(uVar13 + uVar24);
          pvVar18 = (vector<char_*,_std::allocator<char_*>_> *)0x249249249249249;
          if ((char *)0x249249249249248 < in_stack_fffffffffffffe50) {
            in_stack_fffffffffffffe50 = (char *)0x249249249249249;
          }
          if (CARRY8(uVar13,uVar24)) {
            in_stack_fffffffffffffe50 = (char *)0x249249249249249;
          }
          if (in_stack_fffffffffffffe50 == (char *)0x0) {
            pAVar14 = (pointer)0x0;
            piVar16 = __args;
          }
          else {
            pAVar14 = (pointer)operator_new((long)in_stack_fffffffffffffe50 * 0x38);
            piVar16 = extraout_RDX;
          }
          __p = &local_130;
          std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
          construct<main::AtFileStackEntry,int&,std::vector<char*,std::allocator<char*>>>
                    ((allocator_type *)(&pAVar14->parentInd + lVar23 * 2),
                     (AtFileStackEntry *)&local_130._M_first,piVar16,pvVar18);
          pAVar26 = pAVar14;
          for (__a = pAVar4; pAVar5 != __a; __a = __a + 1) {
            pAVar26->parentInd = __a->parentInd;
            (pAVar26->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (pAVar26->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (pAVar26->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__a->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pAVar26->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (pAVar26->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (pAVar26->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__a->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
            destroy<main::AtFileStackEntry>
                      ((allocator_type *)__a,(AtFileStackEntry *)&__p->_M_first);
            pAVar26 = pAVar26 + 1;
          }
          if (pAVar4 != (pointer)0x0) {
            operator_delete(pAVar4,(long)local_1a8.
                                         super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pAVar4);
          }
          local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = pAVar14 + (long)in_stack_fffffffffffffe50;
          local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
          super__Vector_impl_data._M_start = pAVar14;
        }
        else {
          std::allocator_traits<std::allocator<main::AtFileStackEntry>>::
          construct<main::AtFileStackEntry,int&,std::vector<char*,std::allocator<char*>>>
                    ((allocator_type *)
                     local_1a8.
                     super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl
                     .super__Vector_impl_data._M_finish,(AtFileStackEntry *)&local_130._M_first,
                     __args,(vector<char_*,_std::allocator<char_*>_> *)__args_1);
          pAVar26 = pAVar5;
        }
        local_1a8.super__Vector_base<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>._M_impl.
        super__Vector_impl_data._M_finish = pAVar26 + 1;
        if (local_130._M_first._M_storage != (basic_streambuf<char,_std::char_traits<char>_> *)0x0)
        {
          operator_delete((void *)local_130._M_first._M_storage,local_130._16_8_ - local_130._0_8_);
        }
        local_180 = musl_optarg + 1;
        std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                  (&local_158,&local_180,auto_format);
        local_130._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
        local_40 = 0;
        iVar10 = File::open((File *)&local_130._M_first,(char *)&local_158,8);
        if (CONCAT44(extraout_var,iVar10) == 0) {
LAB_001059a6:
          local_38.super_anon_class_8_1_89901123.path = (anon_class_8_1_89901123)&local_158;
          std::
          visit_abi_cxx11_<Visitor<File::string(std::filesystem::__cxx11::path_const&)const::_lambda(std::filebuf_const&)_1_,File::string[abi:cxx11](std::filesystem::__cxx11::path_const&)const::_lambda(std::streambuf_const*)_1_>,std::variant<std::streambuf*,std::filebuf>const&>
                    (&local_178,&local_38,
                     (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                      *)&local_130._M_first);
          _Var6._M_p = local_178._M_dataplus._M_p;
          piVar16 = __errno_location();
          pcVar17 = strerror(*piVar16);
          fatal("Error reading @%s: %s",_Var6._M_p,pcVar17);
        }
        this = &pAVar26->argPool;
        local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = (unsigned_long *)0x0;
        local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
        local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
        bVar8 = false;
LAB_001054cb:
        do {
          pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                    *)&local_178,
                                   (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                    *)&local_130._M_first);
          pbVar1 = *(byte **)(pbVar15 + 0x10);
          if (pbVar1 < *(byte **)(pbVar15 + 0x18)) {
            uVar11 = (uint)*pbVar1;
            *(byte **)(pbVar15 + 0x10) = pbVar1 + 1;
          }
          else {
            uVar11 = (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
          }
          iVar10 = 1;
          if (uVar11 == 0xffffffff) {
            bVar8 = true;
          }
          else {
            iVar10 = isblank(uVar11);
            if (iVar10 != 0) goto LAB_001054cb;
            iVar10 = 3;
            if (uVar11 != 10) {
              if (uVar11 == 0xd) {
                pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                          *)&local_178,
                                         (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                          *)&local_130._M_first);
                if (*(ulong *)(pbVar15 + 0x10) < *(ulong *)(pbVar15 + 0x18)) {
                  *(ulong *)(pbVar15 + 0x10) = *(ulong *)(pbVar15 + 0x10) + 1;
                }
                else {
                  (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
                }
              }
              else if (uVar11 == 0x23) {
                do {
                  pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                            *)&local_178,
                                           (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                            *)&local_130._M_first);
                  pbVar1 = *(byte **)(pbVar15 + 0x10);
                  if (pbVar1 < *(byte **)(pbVar15 + 0x18)) {
                    uVar11 = (uint)*pbVar1;
                    *(byte **)(pbVar15 + 0x10) = pbVar1 + 1;
                  }
                  else {
                    uVar11 = (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
                  }
                  if (uVar11 == 0xffffffff) {
                    bVar8 = true;
                    iVar10 = 1;
                    break;
                  }
                } while (uVar11 != 10);
              }
              else {
                do {
                  local_178._M_dataplus._M_p =
                       (pAVar26->argPool).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish +
                       -(long)(pAVar26->argPool).super__Vector_base<char,_std::allocator<char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<unsigned_long>
                              (&local_1c8,
                               (iterator)
                               local_1c8.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(unsigned_long *)&local_178
                              );
                  }
                  else {
                    *local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish =
                         (unsigned_long)local_178._M_dataplus._M_p;
                    local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish =
                         local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  local_178._M_dataplus._M_p._0_1_ = (char)uVar11;
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>
                            (this,(char *)&local_178);
                  while( true ) {
                    pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                              *)&local_178,
                                             (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                              *)&local_130._M_first);
                    pbVar1 = *(byte **)(pbVar15 + 0x10);
                    if (pbVar1 < *(byte **)(pbVar15 + 0x18)) {
                      uVar11 = (uint)*pbVar1;
                      *(byte **)(pbVar15 + 0x10) = pbVar1 + 1;
                    }
                    else {
                      uVar11 = (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
                    }
                    if (((uVar11 == 0xffffffff) || (uVar11 == 10)) ||
                       (iVar10 = isblank(uVar11), iVar10 != 0)) goto LAB_0010562c;
                    if (uVar11 == 0xd) break;
                    local_178._M_dataplus._M_p._0_1_ = (char)uVar11;
                    std::vector<char,_std::allocator<char>_>::emplace_back<char>
                              (this,(char *)&local_178);
                  }
                  pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                            *)&local_178,
                                           (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                            *)&local_130._M_first);
                  if (*(ulong *)(pbVar15 + 0x10) < *(ulong *)(pbVar15 + 0x18)) {
                    *(ulong *)(pbVar15 + 0x10) = *(ulong *)(pbVar15 + 0x10) + 1;
                  }
                  else {
                    (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
                  }
LAB_0010562c:
                  local_178._M_dataplus._M_p = local_178._M_dataplus._M_p & 0xffffffffffffff00;
                  std::vector<char,_std::allocator<char>_>::emplace_back<char>
                            (this,(char *)&local_178);
                  while (iVar10 = isblank(uVar11), iVar10 != 0) {
                    pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                              *)&local_178,
                                             (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                              *)&local_130._M_first);
                    pbVar1 = *(byte **)(pbVar15 + 0x10);
                    if (pbVar1 < *(byte **)(pbVar15 + 0x18)) {
                      uVar11 = (uint)*pbVar1;
                      *(byte **)(pbVar15 + 0x10) = pbVar1 + 1;
                    }
                    else {
                      uVar11 = (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
                    }
                  }
                  if (uVar11 == 0xd) {
                    pbVar15 = std::operator*((Visitor<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:62:29),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_ISSOtm[P]rgbds_include_file_hpp:63:29)>
                                              *)&local_178,
                                             (variant<std::basic_streambuf<char,_std::char_traits<char>_>_*,_std::basic_filebuf<char,_std::char_traits<char>_>_>
                                              *)&local_130._M_first);
                    pbVar1 = *(byte **)(pbVar15 + 0x10);
                    if (pbVar1 < *(byte **)(pbVar15 + 0x18)) {
                      uVar11 = (uint)*pbVar1;
                      *(byte **)(pbVar15 + 0x10) = pbVar1 + 1;
                    }
                    else {
                      uVar11 = (**(code **)(*(long *)pbVar15 + 0x50))(pbVar15);
                    }
                  }
                } while ((uVar11 != 0xffffffff) && (uVar11 != 10));
                iVar10 = 0;
              }
            }
          }
        } while ((iVar10 == 0) || (iVar10 == 3));
        if ((!bVar8) &&
           (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_long *)0x0)) {
          operator_delete(local_1c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        File::~File((File *)&local_130._M_first);
        std::filesystem::__cxx11::path::~path(&local_158);
        pvVar18 = &pAVar26->argv;
        std::vector<char_*,_std::allocator<char_*>_>::reserve
                  (pvVar18,((long)local_1c8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1c8.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) + 2);
        puVar3 = local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (puVar22 = local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start; puVar22 != puVar3;
            puVar22 = puVar22 + 1) {
          local_130._M_first._M_storage =
               (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
               ((this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start + *puVar22);
          std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                    ((vector<char*,std::allocator<char*>> *)pvVar18,(char **)&local_130._M_first);
        }
        local_130._M_first._M_storage =
             (_Uninitialized<std::basic_streambuf<char,_std::char_traits<char>_>_*,_true>)
             (basic_streambuf<char,_std::char_traits<char>_> *)0x0;
        std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                  ((vector<char*,std::allocator<char*>> *)pvVar18,(char **)&local_130._M_first);
        argv = (char **)local_190;
        local_1d0 = (AtFileStackEntry *)
                    (pAVar26->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppcVar2 = (pAVar26->argv).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        musl_optind = 1;
        if (local_1c8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
          operator_delete(local_1c8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1c8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar13 = (ulong)((int)((ulong)((long)ppcVar2 - (long)local_1d0) >> 3) - 1);
        bVar8 = false;
      }
      if (bVar8) {
        uVar11 = (uint)options.nbColorsPerPal;
        pcVar17 = (char *)(ulong)(uint)options.bitDepth;
        uVar19 = 1 << (options.bitDepth & 0x1f);
        if (uVar11 == 0) {
          options.nbColorsPerPal = (uint8_t)uVar19;
        }
        else if (uVar19 < uVar11) {
          pcVar17 = (char *)(ulong)uVar11;
          error("%ubpp palettes can only contain %u colors, not %u",(ulong)(uint)options.bitDepth);
        }
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_1,true,
                   (optional<std::filesystem::__cxx11::path> *)".attrmap",pcVar17);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_2,true,
                   (optional<std::filesystem::__cxx11::path> *)".tilemap",pcVar17);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_3,true,
                   (optional<std::filesystem::__cxx11::path> *)".pal",pcVar17);
        main::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(ulong)_ZL12localOptions_4,true,
                   (optional<std::filesystem::__cxx11::path> *)".palmap",pcVar17);
        if (_ZL12localOptions_0 != (char *)0x0) {
          parseExternalPalSpec(_ZL12localOptions_0);
        }
        if (options.verbosity != '\0') {
          get_package_version_string();
          main_cold_16();
        }
        if (nbErrors == 0) {
          if (options.input.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
              _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>
              .super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged == true) {
            if (options.reversedWidth == 0) {
              process();
            }
            else {
              reverse();
            }
          }
          else {
            if (((options.palettes.
                  super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
                  super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
                  super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged != true)
                || (options.palSpecType != EXPLICIT)) || (options.reversedWidth != 0)) {
              main_cold_17();
              std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::~vector(&local_1a8);
              _Unwind_Resume(extraout_RAX);
            }
            processPalettes();
          }
          if (nbErrors == 0) {
            std::vector<AtFileStackEntry,_std::allocator<AtFileStackEntry>_>::~vector(&local_1a8);
            return 0;
          }
        }
        giveUp();
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
	struct AtFileStackEntry {
		int parentInd; // Saved offset into parent argv
		std::vector<char *> argv; // This context's arg pointer vec
		std::vector<char> argPool;

		AtFileStackEntry(int parentInd_, std::vector<char *> argv_)
		    : parentInd(parentInd_), argv(argv_) {}
	};
	std::vector<AtFileStackEntry> atFileStack;

	int curArgc = argc;
	char **curArgv = argv;
	for (;;) {
		char *atFileName = parseArgv(curArgc, curArgv);
		if (atFileName) {
			// Copy `argv[0]` for error reporting, and because option parsing skips it
			AtFileStackEntry &stackEntry =
			    atFileStack.emplace_back(musl_optind, std::vector{atFileName});
			// It would be nice to compute the char pointers on the fly, but reallocs don't allow
			// that; so we must compute the offsets after the pool is fixed
			auto offsets = readAtFile(&musl_optarg[1], stackEntry.argPool);
			stackEntry.argv.reserve(offsets.size() + 2); // Avoid a bunch of reallocs
			for (size_t ofs : offsets) {
				stackEntry.argv.push_back(&stackEntry.argPool.data()[ofs]);
			}
			stackEntry.argv.push_back(nullptr); // Don't forget the arg vector terminator!

			curArgc = stackEntry.argv.size() - 1;
			curArgv = stackEntry.argv.data();
			musl_optind = 1; // Don't use 0 because we're not scanning a different argv per se
			continue; // Begin scanning that arg vector
		}

		if (musl_optind != curArgc) {
			// This happens if `--` is passed, process the remaining arg(s) as positional
			assert(musl_optind < curArgc);
			for (int i = musl_optind; i < curArgc; ++i) {
				registerInput(argv[i]);
			}
		}

		// Pop off the top stack entry, or end parsing if none
		if (atFileStack.empty()) {
			break;
		}
		// OK to restore `optind` directly, because `optpos` must be 0 right now.
		// (Providing 0 would be a "proper" reset, but we want to resume parsing)
		musl_optind = atFileStack.back().parentInd;
		atFileStack.pop_back();
		if (atFileStack.empty()) {
			curArgc = argc;
			curArgv = argv;
		} else {
			auto &vec = atFileStack.back().argv;
			curArgc = vec.size();
			curArgv = vec.data();
		}
	}

	if (options.nbColorsPerPal == 0) {
		options.nbColorsPerPal = 1u << options.bitDepth;
	} else if (options.nbColorsPerPal > 1u << options.bitDepth) {
		error("%" PRIu8 "bpp palettes can only contain %u colors, not %" PRIu8, options.bitDepth,
		      1u << options.bitDepth, options.nbColorsPerPal);
	}

	auto autoOutPath = [](bool autoOptEnabled, std::optional<std::filesystem::path> &path,
	                      char const *extension) {
		if (autoOptEnabled) {
			auto image = localOptions.groupOutputs ? options.output : options.input;
			if (!image.has_value()) {
				fprintf(stderr, "FATAL: No %s specified\n", localOptions.groupOutputs
				      ? "output tile data file" : "input image");
				printUsage();
				exit(1);
			}
			path.emplace(*image).replace_extension(extension);
		}
	};
	autoOutPath(localOptions.autoAttrmap, options.attrmap, ".attrmap");
	autoOutPath(localOptions.autoTilemap, options.tilemap, ".tilemap");
	autoOutPath(localOptions.autoPalettes, options.palettes, ".pal");
	autoOutPath(localOptions.autoPalmap, options.palmap, ".palmap");

	// Execute deferred external pal spec parsing, now that all other params are known
	if (localOptions.externalPalSpec) {
		parseExternalPalSpec(localOptions.externalPalSpec);
	}

	if (options.verbosity >= Options::VERB_CFG) {
		fprintf(stderr, "rgbgfx %s\n", get_package_version_string());

		if (options.verbosity >= Options::VERB_VVVVVV) {
			putc('\n', stderr);
			static std::array<uint16_t, 21> gfx{
			    0x1FE, 0x3FF, 0x399, 0x399, 0x3FF, 0x3FF, 0x381, 0x3C3, 0x1FE, 0x078, 0x1FE,
			    0x3FF, 0x3FF, 0x3FF, 0x37B, 0x37B, 0x0FC, 0x0CC, 0x1CE, 0x1CE, 0x1CE,
			};
			static std::array<char const *, 3> textbox{
			    "  ,----------------------------------------.",
			    "  | Augh, dimensional interference again?! |",
			    "  `----------------------------------------'"};
			for (size_t i = 0; i < gfx.size(); ++i) {
				uint16_t row = gfx[i];
				for (uint8_t _ = 0; _ < 10; ++_) {
					unsigned char c = row & 1 ? '0' : ' ';
					putc(c, stderr);
					// Double the pixel horizontally, otherwise the aspect ratio looks wrong
					putc(c, stderr);
					row >>= 1;
				}
				if (i < textbox.size()) {
					fputs(textbox[i], stderr);
				}
				putc('\n', stderr);
			}
			putc('\n', stderr);
		}

		fputs("Options:\n", stderr);
		if (options.columnMajor)
			fputs("\tVisit image in column-major order\n", stderr);
		if (options.allowMirroring)
			fputs("\tAllow mirroring tiles\n", stderr);
		if (options.allowDedup)
			fputs("\tAllow deduplicating tiles\n", stderr);
		if (options.useColorCurve)
			fputs("\tUse color curve\n", stderr);
		fprintf(stderr, "\tBit depth: %" PRIu8 "bpp\n", options.bitDepth);
		if (options.trim != 0)
			fprintf(stderr, "\tTrim the last %" PRIu64 " tiles\n", options.trim);
		fprintf(stderr, "\tMaximum %" PRIu8 " palettes\n", options.nbPalettes);
		fprintf(stderr, "\tPalettes contain %" PRIu8 " colors\n", options.nbColorsPerPal);
		fprintf(stderr, "\t%s palette spec\n", []() {
			switch (options.palSpecType) {
			case Options::NO_SPEC:
				return "No";
			case Options::EXPLICIT:
				return "Explicit";
			case Options::EMBEDDED:
				return "Embedded";
			}
			return "???";
		}());
		if (options.palSpecType == Options::EXPLICIT) {
			fputs("\t[\n", stderr);
			for (std::array<Rgba, 4> const &pal : options.palSpec) {
				fprintf(stderr, "\t\t#%06x, #%06x, #%06x, #%06x,\n", pal[0].toCSS() >> 8,
				        pal[1].toCSS() >> 8, pal[2].toCSS() >> 8, pal[3].toCSS() >> 8);
			}
			fputs("\t]\n", stderr);
		}
		fprintf(stderr,
		        "\tInput image slice: %" PRIu32 "x%" PRIu32 " pixels starting at (%" PRIi32
		        ", %" PRIi32 ")\n",
		        options.inputSlice.width, options.inputSlice.height, options.inputSlice.left,
		        options.inputSlice.top);
		fprintf(stderr, "\tBase tile IDs: [%" PRIu8 ", %" PRIu8 "]\n", options.baseTileIDs[0],
		        options.baseTileIDs[1]);
		fprintf(stderr, "\tMaximum %" PRIu16 " tiles in bank 0, %" PRIu16 " in bank 1\n",
		        options.maxNbTiles[0], options.maxNbTiles[1]);
		auto printPath = [](char const *name,
		                    std::optional<std::filesystem::path> const &path) {
			if (path.has_value()) {
				fprintf(stderr, "\t%s: %s\n", name, path->c_str());
			}
		};
		printPath("Input image", options.input);
		printPath("Output tile data", options.output);
		printPath("Output tilemap", options.tilemap);
		printPath("Output attrmap", options.attrmap);
		printPath("Output palettes", options.palettes);
		fputs("Ready.\n", stderr);
	}

	// Do not do anything if option parsing went wrong
	if (nbErrors) {
		giveUp();
	}

	if (options.input.has_value()) {
		if (options.reverse()) {
			reverse();
		} else {
			process();
		}
	} else if (options.palettes.has_value() && options.palSpecType == Options::EXPLICIT
		&& !options.reverse()) {
		processPalettes();
	} else {
		fputs("FATAL: No input image specified\n", stderr);
		printUsage();
		exit(1);
	}

	if (nbErrors) {
		giveUp();
	}
	return 0;
}